

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::ArbitrarySymbolExpression::ArbitrarySymbolExpression
          (ArbitrarySymbolExpression *this,Scope *scope,Symbol *symbol,Type *type,
          HierarchicalReference *hierRef,SourceRange sourceRange)

{
  HierarchicalReference *this_00;
  Symbol *pSVar1;
  Expression *pEVar2;
  size_t sVar3;
  bool bVar4;
  
  (this->super_Expression).kind = ArbitrarySymbol;
  (this->super_Expression).type.ptr = type;
  (this->super_Expression).constant = (ConstantValue *)0x0;
  (this->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (this->super_Expression).sourceRange.startLoc = sourceRange.startLoc;
  (this->super_Expression).sourceRange.endLoc = sourceRange.endLoc;
  (this->symbol).ptr = symbol;
  (this->hierRef).target = (Symbol *)0x0;
  (this->hierRef).expr = (Expression *)0x0;
  (this->hierRef).path._M_ptr = (pointer)0x0;
  (this->hierRef).path._M_extent._M_extent_value = 0;
  (this->hierRef).upwardCount = 0;
  if ((hierRef != (HierarchicalReference *)0x0) && (hierRef->target != (Symbol *)0x0)) {
    this_00 = &this->hierRef;
    (this->hierRef).upwardCount = hierRef->upwardCount;
    pSVar1 = hierRef->target;
    pEVar2 = hierRef->expr;
    sVar3 = (hierRef->path)._M_extent._M_extent_value;
    (this->hierRef).path._M_ptr = (hierRef->path)._M_ptr;
    (this->hierRef).path._M_extent._M_extent_value = sVar3;
    this_00->target = pSVar1;
    (this->hierRef).expr = pEVar2;
    (this->hierRef).expr = &this->super_Expression;
    bVar4 = HierarchicalReference::isUpward(this_00);
    if (bVar4) {
      Compilation::noteUpwardReference(scope->compilation,scope,this_00);
      return;
    }
  }
  return;
}

Assistant:

std::optional<bitwidth_t> ValueExpressionBase::getEffectiveWidthImpl() const {
    switch (symbol.kind) {
        case SymbolKind::Parameter:
            return symbol.as<ParameterSymbol>().getValue(sourceRange).getEffectiveWidth();
        case SymbolKind::EnumValue:
            return symbol.as<EnumValueSymbol>().getValue(sourceRange).getEffectiveWidth();
        case SymbolKind::Specparam:
            return symbol.as<SpecparamSymbol>().getValue(sourceRange).getEffectiveWidth();
        default:
            return type->getBitWidth();
    }
}